

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

bool ImGui::BeginTableEx(char *name,ImGuiID id,int columns_count,ImGuiTableFlags flags,
                        ImVec2 *outer_size,float inner_width)

{
  ImSpan<ImGuiTableColumn> *this;
  double dVar1;
  short sVar2;
  ImGuiWindow *outer_window;
  ImGuiWindow *pIVar3;
  ImVec2 IVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  uint uVar7;
  ImU32 IVar8;
  ImPoolIdx i;
  ImGuiTable *p;
  float *pfVar9;
  ImGuiTableColumn *pIVar10;
  char *pcVar11;
  ImRect *pIVar12;
  ImS16 IVar13;
  ImGuiContext *g;
  int n;
  int iVar14;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  ImRect IVar19;
  uint local_b8;
  ImGuiID local_b4;
  ImRect outer_rect;
  undefined1 local_78 [8];
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined3 uStack_50;
  undefined5 uStack_4d;
  undefined4 local_48;
  undefined4 local_44;
  undefined3 uStack_40;
  
  pIVar5 = GImGui;
  outer_window = GImGui->CurrentWindow;
  outer_window->WriteAccessed = true;
  if (outer_window->SkipItems != false) {
    return false;
  }
  if (0x3f < columns_count - 1U) {
    __assert_fail("columns_count > 0 && columns_count <= 64 && \"Only 1..64 columns allowed!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O2/_deps/imgui-src/imgui_tables.cpp"
                  ,0x133,
                  "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                 );
  }
  if ((((uint)flags >> 0x18 & 1) != 0) && (inner_width < 0.0)) {
    __assert_fail("inner_width >= 0.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O2/_deps/imgui-src/imgui_tables.cpp"
                  ,0x135,
                  "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                 );
  }
  IVar4 = GetContentRegionAvail();
  fVar16 = IVar4.y;
  auVar15._8_4_ = extraout_XMM0_Dc;
  auVar15._0_4_ = IVar4.x;
  auVar15._4_4_ = IVar4.y;
  auVar15._12_4_ = extraout_XMM0_Dd;
  if (IVar4.x <= 1.0) {
    auVar15._0_4_ = 0x3f800000;
  }
  if ((flags & 0x3000000U) == 0) {
    IVar4 = CalcItemSize(*outer_size,auVar15._0_4_,0.0);
    outer_rect.Min = (outer_window->DC).CursorPos;
    outer_rect.Max.y = IVar4.y + outer_rect.Min.y;
    outer_rect.Max.x = IVar4.x + outer_rect.Min.x;
  }
  else {
    if (fVar16 <= 1.0) {
      fVar16 = 1.0;
    }
    IVar4 = CalcItemSize(*outer_size,auVar15._0_4_,fVar16);
    outer_rect.Min = (outer_window->DC).CursorPos;
    outer_rect.Max.y = IVar4.y + outer_rect.Min.y;
    outer_rect.Max.x = IVar4.x + outer_rect.Min.x;
    bVar6 = IsClippedEx(&outer_rect,0,false);
    if (bVar6) {
      ItemSize(&outer_rect,-1.0);
      return false;
    }
  }
  p = ImPool<ImGuiTable>::GetOrAddByKey(&pIVar5->Tables,id);
  if (p->LastFrameActive == pIVar5->FrameCount) {
    sVar2 = p->InstanceCurrent;
    IVar13 = sVar2 + 1;
    local_b4 = (int)sVar2 + id + 1;
    local_b8 = p->Flags;
    if ((-1 < sVar2) && (p->ColumnsCount != columns_count)) {
      __assert_fail("table->ColumnsCount == columns_count && \"BeginTable(): Cannot change columns count mid-frame while preserving same ID\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O2/_deps/imgui-src/imgui_tables.cpp"
                    ,0x148,
                    "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                   );
    }
  }
  else {
    local_b8 = p->Flags;
    IVar13 = 0;
    local_b4 = id;
  }
  p->IsDefaultSizingPolicy = (flags & 0xe000U) == 0;
  uVar7 = TableFixFlags(flags,outer_window);
  p->ID = id;
  p->Flags = uVar7;
  p->InstanceCurrent = IVar13;
  p->LastFrameActive = pIVar5->FrameCount;
  p->InnerWindow = outer_window;
  p->OuterWindow = outer_window;
  p->ColumnsCount = columns_count;
  p->IsLayoutLocked = false;
  p->InnerWidth = inner_width;
  p->UserOuterSize = *outer_size;
  if ((flags & 0x3000000U) == 0) {
    (p->InnerRect).Min = outer_rect.Min;
    (p->InnerRect).Max = outer_rect.Max;
    (p->OuterRect).Min = outer_rect.Min;
    (p->OuterRect).Max = outer_rect.Max;
    (p->WorkRect).Min = outer_rect.Min;
    (p->WorkRect).Max = outer_rect.Max;
  }
  else {
    fVar16 = inner_width;
    if ((uVar7 & 0x1000000) == 0) {
      fVar16 = 3.4028235e+38;
    }
    local_78._4_4_ = 0.0;
    fVar16 = (float)(~-(uint)(0.0 < inner_width) & 0x7f7fffff |
                    (uint)fVar16 & -(uint)(0.0 < inner_width));
    if ((((uVar7 & 0x3000000) == 0x1000000) || (fVar16 != 3.4028235e+38)) || (NAN(fVar16))) {
      if ((uVar7 & 0x3000000) == 0x1000000) {
        local_78._4_4_ = 1.1754944e-38;
      }
      local_78._0_4_ = -(uint)(fVar16 != 3.4028235e+38) & (uint)fVar16;
      SetNextWindowContentSize((ImVec2 *)local_78);
    }
    if ((local_b8 & 0x3000000) == 0) {
      local_78._0_4_ = 0.0;
      local_78._4_4_ = 0.0;
      SetNextWindowScroll((ImVec2 *)local_78);
    }
    local_78._0_4_ = outer_rect.Max.x - outer_rect.Min.x;
    local_78._4_4_ = outer_rect.Max.y - outer_rect.Min.y;
    BeginChildEx(name,local_b4,(ImVec2 *)local_78,false,(uVar7 & 0x1000000) >> 0xd);
    pIVar3 = pIVar5->CurrentWindow;
    p->InnerWindow = pIVar3;
    IVar4 = (pIVar3->WorkRect).Max;
    (p->WorkRect).Min = (pIVar3->WorkRect).Min;
    (p->WorkRect).Max = IVar4;
    IVar19 = ImGuiWindow::Rect(pIVar3);
    p->OuterRect = IVar19;
    pIVar3 = p->InnerWindow;
    IVar4 = (pIVar3->InnerRect).Max;
    (p->InnerRect).Min = (pIVar3->InnerRect).Min;
    (p->InnerRect).Max = IVar4;
    fVar16 = (pIVar3->WindowPadding).x;
    if ((((fVar16 != 0.0) || (NAN(fVar16))) ||
        ((fVar16 = (pIVar3->WindowPadding).y, fVar16 != 0.0 ||
         ((NAN(fVar16) || (pIVar3->WindowBorderSize != 0.0)))))) || (NAN(pIVar3->WindowBorderSize)))
    {
      __assert_fail("table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O2/_deps/imgui-src/imgui_tables.cpp"
                    ,0x177,
                    "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                   );
    }
  }
  PushOverrideID(0);
  pIVar3 = p->InnerWindow;
  p->HostIndentX = (pIVar3->DC).Indent.x;
  IVar4 = (pIVar3->ClipRect).Max;
  (p->HostClipRect).Min = (pIVar3->ClipRect).Min;
  (p->HostClipRect).Max = IVar4;
  p->HostSkipItems = pIVar3->SkipItems;
  IVar4 = (pIVar3->WorkRect).Max;
  (p->HostBackupWorkRect).Min = (pIVar3->WorkRect).Min;
  (p->HostBackupWorkRect).Max = IVar4;
  IVar4 = (pIVar3->ParentWorkRect).Max;
  (p->HostBackupParentWorkRect).Min = (pIVar3->ParentWorkRect).Min;
  (p->HostBackupParentWorkRect).Max = IVar4;
  (p->HostBackupColumnsOffset).x = (outer_window->DC).ColumnsOffset.x;
  p->HostBackupPrevLineSize = (pIVar3->DC).PrevLineSize;
  p->HostBackupCurrLineSize = (pIVar3->DC).CurrLineSize;
  p->HostBackupCursorMaxPos = (pIVar3->DC).CursorMaxPos;
  p->HostBackupItemWidth = (outer_window->DC).ItemWidth;
  p->HostBackupItemWidthStackSize = (outer_window->DC).ItemWidthStack.Size;
  fVar16 = 0.0;
  fVar18 = 0.0;
  if ((uVar7 >> 9 & 1) != 0) {
    fVar18 = 1.0;
  }
  (pIVar3->DC).CurrLineSize.x = 0.0;
  (pIVar3->DC).CurrLineSize.y = 0.0;
  (pIVar3->DC).PrevLineSize.x = 0.0;
  (pIVar3->DC).PrevLineSize.y = 0.0;
  if ((uVar7 & 0x800200) == 0x200) {
    fVar16 = (pIVar5->Style).CellPadding.x;
LAB_0014f077:
    fVar17 = 0.0;
  }
  else {
    if ((uVar7 & 0x800200) != 0) goto LAB_0014f077;
    fVar17 = (pIVar5->Style).CellPadding.x;
  }
  p->CellSpacingX1 = fVar18 + fVar17;
  p->CellSpacingX2 = fVar17;
  p->CellPaddingX = fVar16;
  p->CellPaddingY = (pIVar5->Style).CellPadding.y;
  fVar18 = 0.0;
  fVar17 = 0.0;
  if ((uVar7 >> 10 & 1) != 0) {
    fVar17 = 1.0;
  }
  if ((uVar7 >> 0x16 & 1) == 0 && (uVar7 & 0x200400) != 0) {
    fVar18 = (pIVar5->Style).CellPadding.x;
  }
  p->OuterPaddingX = (fVar17 + fVar18) - fVar16;
  p->CurrentRow = -1;
  p->CurrentColumn = -1;
  p->RowBgColorCounter = 0;
  pIVar12 = &pIVar3->ClipRect;
  if (pIVar3 == outer_window) {
    pIVar12 = &p->WorkRect;
  }
  *(uint *)&p->field_0x90 = (uint)*(ushort *)&p->field_0x90;
  IVar4 = pIVar12->Max;
  (p->InnerClipRect).Min = pIVar12->Min;
  (p->InnerClipRect).Max = IVar4;
  ImRect::ClipWith(&p->InnerClipRect,&p->WorkRect);
  ImRect::ClipWithFull(&p->InnerClipRect,&p->HostClipRect);
  if ((uVar7 >> 0x11 & 1) == 0) {
    fVar16 = (pIVar3->ClipRect).Max.y;
  }
  else {
    fVar16 = (p->InnerClipRect).Max.y;
    fVar18 = (pIVar3->WorkRect).Max.y;
    if (fVar18 <= fVar16) {
      fVar16 = fVar18;
    }
  }
  (p->InnerClipRect).Max.y = fVar16;
  fVar16 = (p->WorkRect).Min.y;
  p->RowPosY2 = fVar16;
  p->RowPosY1 = fVar16;
  p->RowTextBaseline = 0.0;
  p->FreezeRowsRequest = '\0';
  p->FreezeRowsCount = '\0';
  p->FreezeColumnsRequest = '\0';
  p->FreezeColumnsCount = '\0';
  p->IsUnfrozenRows = true;
  p->DeclColumnsCount = '\0';
  IVar8 = GetColorU32(0x2b,1.0);
  p->BorderColorStrong = IVar8;
  IVar8 = GetColorU32(0x2c,1.0);
  p->BorderColorLight = IVar8;
  i = ImPool<ImGuiTable>::GetIndex(&pIVar5->Tables,p);
  local_78._0_4_ = 0.0;
  local_78._4_4_ = 0.0;
  uStack_70._0_4_ = i;
  ImVector<ImGuiPtrOrIndex>::push_back(&pIVar5->CurrentTableStack,(ImGuiPtrOrIndex *)local_78);
  pIVar5->CurrentTable = p;
  (outer_window->DC).CurrentTableIdx = i;
  if (pIVar3 != outer_window) {
    (pIVar3->DC).CurrentTableIdx = i;
  }
  if (((local_b8 & 2) != 0) && ((uVar7 & 2) == 0)) {
    p->IsResetDisplayOrderRequest = true;
  }
  if ((pIVar5->TablesLastTimeActive).Size <= i) {
    local_78._0_4_ = -1.0;
    ImVector<float>::resize(&pIVar5->TablesLastTimeActive,i + 1,(float *)local_78);
  }
  dVar1 = pIVar5->Time;
  pfVar9 = ImVector<float>::operator[](&pIVar5->TablesLastTimeActive,i);
  *pfVar9 = (float)dVar1;
  p->MemoryCompacted = false;
  iVar14 = (int)(((long)(p->Columns).DataEnd - (long)(p->Columns).Data) / 0x68);
  if (iVar14 == columns_count || iVar14 == 0) {
    if (p->RawData == (void *)0x0) goto LAB_0014f2c8;
  }
  else {
    MemFree(p->RawData);
    p->RawData = (void *)0x0;
LAB_0014f2c8:
    TableBeginInitMemory(p,columns_count);
    p->IsSettingsRequestLoad = true;
    p->IsInitializing = true;
  }
  this = &p->Columns;
  if (p->IsResetAllRequest == true) {
    p->IsInitializing = true;
    p->IsResetAllRequest = false;
    p->IsSettingsRequestLoad = false;
    p->IsSettingsDirty = true;
    p->SettingsLoadedFlags = 0;
  }
  else if ((p->IsInitializing & 1U) == 0) goto LAB_0014f409;
  p->SettingsOffset = -1;
  p->IsSortSpecsDirty = true;
  p->InstanceInteracted = -1;
  p->ContextPopupColumn = -1;
  p->ReorderColumn = -1;
  p->LastResizedColumn = -1;
  p->HoveredColumnBody = -1;
  p->HoveredColumnBorder = -1;
  p->AutoFitSingleColumn = -1;
  p->ResizedColumn = -1;
  for (iVar14 = 0; columns_count != iVar14; iVar14 = iVar14 + 1) {
    pIVar10 = ImSpan<ImGuiTableColumn>::operator[](this,iVar14);
    local_58 = 0;
    uStack_50 = 0;
    uStack_4d = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_48 = 0;
    local_78._0_4_ = 0.0;
    local_78._4_4_ = 0.0;
    uStack_70._0_4_ = 0;
    uStack_70._4_4_ = 0;
    uStack_40 = 0xffffff;
    local_44 = 0xffffffff;
    pIVar10->Flags = 0;
    pIVar10->WidthGiven = 0.0;
    pIVar10->MinX = 0.0;
    pIVar10->MaxX = 0.0;
    pIVar10->WidthRequest = -1.0;
    pIVar10->StretchWeight = -1.0;
    pIVar10->InitStretchWeightOrWidth = 0.0;
    (pIVar10->ClipRect).Min.x = 0.0;
    *(undefined8 *)&(pIVar10->ClipRect).Min.y = 0;
    *(undefined8 *)&(pIVar10->ClipRect).Max.y = 0;
    pIVar10->WorkMinX = 0.0;
    pIVar10->WorkMaxX = 0.0;
    pIVar10->ItemWidth = 0.0;
    pIVar10->ContentMaxXFrozen = 0.0;
    pIVar10->ContentMaxXUnfrozen = 0.0;
    pIVar10->ContentMaxXHeadersUsed = 0.0;
    *(undefined8 *)((long)&pIVar10->ContentMaxXUnfrozen + 3) = 0;
    *(undefined8 *)((long)&pIVar10->ContentMaxXHeadersIdeal + 3) = 0xffffffffffffff00;
    pIVar10->DrawChannelCurrent = 0xff;
    pIVar10->DrawChannelFrozen = 0xff;
    pIVar10->DrawChannelUnfrozen = 0xff;
    pIVar10->IsEnabled = false;
    pIVar10->IsEnabledNextFrame = false;
    pIVar10->IsVisibleX = false;
    pIVar10->IsVisibleY = false;
    pIVar10->IsRequestOutput = false;
    pIVar10->IsSkipItems = false;
    pIVar10->IsPreserveWidthAuto = false;
    pIVar10->NavLayerCurrent = '\0';
    pIVar10->AutoFitQueue = '\0';
    pIVar10->CannotSkipItemsQueue = '\0';
    pIVar10->field_0x64 = 0;
    pIVar10->SortDirectionsAvailList = '\0';
    pIVar10->IsPreserveWidthAuto = true;
    pcVar11 = ImSpan<signed_char>::operator[](&p->DisplayOrderToIndex,iVar14);
    *pcVar11 = (ImGuiTableColumnIdx)iVar14;
    pIVar10->DisplayOrder = (ImGuiTableColumnIdx)iVar14;
    pIVar10->IsEnabled = true;
    pIVar10->IsEnabledNextFrame = true;
  }
LAB_0014f409:
  if (p->IsSettingsRequestLoad == true) {
    TableLoadSettings(p);
  }
  fVar16 = pIVar5->FontSize;
  fVar18 = p->RefScale;
  if ((fVar18 != 0.0) || (NAN(fVar18))) {
    if ((fVar18 != fVar16) || (NAN(fVar18) || NAN(fVar16))) {
      for (iVar14 = 0; columns_count != iVar14; iVar14 = iVar14 + 1) {
        pIVar10 = ImSpan<ImGuiTableColumn>::operator[](this,iVar14);
        fVar17 = pIVar10->WidthRequest;
        pIVar10 = ImSpan<ImGuiTableColumn>::operator[](this,iVar14);
        pIVar10->WidthRequest = fVar17 * (fVar16 / fVar18);
      }
    }
  }
  p->RefScale = fVar16;
  pIVar3->SkipItems = true;
  if (0 < (p->ColumnsNames).Buf.Size) {
    ImVector<char>::resize(&(p->ColumnsNames).Buf,0);
  }
  TableBeginApplyRequests(p);
  return true;
}

Assistant:

bool    ImGui::BeginTableEx(const char* name, ImGuiID id, int columns_count, ImGuiTableFlags flags, const ImVec2& outer_size, float inner_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* outer_window = GetCurrentWindow();
    if (outer_window->SkipItems) // Consistent with other tables + beneficial side effect that assert on miscalling EndTable() will be more visible.
        return false;

    // Sanity checks
    IM_ASSERT(columns_count > 0 && columns_count <= IMGUI_TABLE_MAX_COLUMNS && "Only 1..64 columns allowed!");
    if (flags & ImGuiTableFlags_ScrollX)
        IM_ASSERT(inner_width >= 0.0f);

    // If an outer size is specified ahead we will be able to early out when not visible. Exact clipping rules may evolve.
    const bool use_child_window = (flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) != 0;
    const ImVec2 avail_size = GetContentRegionAvail();
    ImVec2 actual_outer_size = CalcItemSize(outer_size, ImMax(avail_size.x, 1.0f), use_child_window ? ImMax(avail_size.y, 1.0f) : 0.0f);
    ImRect outer_rect(outer_window->DC.CursorPos, outer_window->DC.CursorPos + actual_outer_size);
    if (use_child_window && IsClippedEx(outer_rect, 0, false))
    {
        ItemSize(outer_rect);
        return false;
    }

    // Acquire storage for the table
    ImGuiTable* table = g.Tables.GetOrAddByKey(id);
    const int instance_no = (table->LastFrameActive != g.FrameCount) ? 0 : table->InstanceCurrent + 1;
    const ImGuiID instance_id = id + instance_no;
    const ImGuiTableFlags table_last_flags = table->Flags;
    if (instance_no > 0)
        IM_ASSERT(table->ColumnsCount == columns_count && "BeginTable(): Cannot change columns count mid-frame while preserving same ID");

    // Fix flags
    table->IsDefaultSizingPolicy = (flags & ImGuiTableFlags_SizingMask_) == 0;
    flags = TableFixFlags(flags, outer_window);

    // Initialize
    table->ID = id;
    table->Flags = flags;
    table->InstanceCurrent = (ImS16)instance_no;
    table->LastFrameActive = g.FrameCount;
    table->OuterWindow = table->InnerWindow = outer_window;
    table->ColumnsCount = columns_count;
    table->IsLayoutLocked = false;
    table->InnerWidth = inner_width;
    table->UserOuterSize = outer_size;

    // When not using a child window, WorkRect.Max will grow as we append contents.
    if (use_child_window)
    {
        // Ensure no vertical scrollbar appears if we only want horizontal one, to make flag consistent
        // (we have no other way to disable vertical scrollbar of a window while keeping the horizontal one showing)
        ImVec2 override_content_size(FLT_MAX, FLT_MAX);
        if ((flags & ImGuiTableFlags_ScrollX) && !(flags & ImGuiTableFlags_ScrollY))
            override_content_size.y = FLT_MIN;

        // Ensure specified width (when not specified, Stretched columns will act as if the width == OuterWidth and
        // never lead to any scrolling). We don't handle inner_width < 0.0f, we could potentially use it to right-align
        // based on the right side of the child window work rect, which would require knowing ahead if we are going to
        // have decoration taking horizontal spaces (typically a vertical scrollbar).
        if ((flags & ImGuiTableFlags_ScrollX) && inner_width > 0.0f)
            override_content_size.x = inner_width;

        if (override_content_size.x != FLT_MAX || override_content_size.y != FLT_MAX)
            SetNextWindowContentSize(ImVec2(override_content_size.x != FLT_MAX ? override_content_size.x : 0.0f, override_content_size.y != FLT_MAX ? override_content_size.y : 0.0f));

        // Reset scroll if we are reactivating it
        if ((table_last_flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) == 0)
            SetNextWindowScroll(ImVec2(0.0f, 0.0f));

        // Create scrolling region (without border and zero window padding)
        ImGuiWindowFlags child_flags = (flags & ImGuiTableFlags_ScrollX) ? ImGuiWindowFlags_HorizontalScrollbar : ImGuiWindowFlags_None;
        BeginChildEx(name, instance_id, outer_rect.GetSize(), false, child_flags);
        table->InnerWindow = g.CurrentWindow;
        table->WorkRect = table->InnerWindow->WorkRect;
        table->OuterRect = table->InnerWindow->Rect();
        table->InnerRect = table->InnerWindow->InnerRect;
        IM_ASSERT(table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f);
    }
    else
    {
        // For non-scrolling tables, WorkRect == OuterRect == InnerRect.
        // But at this point we do NOT have a correct value for .Max.y (unless a height has been explicitly passed in). It will only be updated in EndTable().
        table->WorkRect = table->OuterRect = table->InnerRect = outer_rect;
    }

    // Push a standardized ID for both child-using and not-child-using tables
    PushOverrideID(instance_id);

    // Backup a copy of host window members we will modify
    ImGuiWindow* inner_window = table->InnerWindow;
    table->HostIndentX = inner_window->DC.Indent.x;
    table->HostClipRect = inner_window->ClipRect;
    table->HostSkipItems = inner_window->SkipItems;
    table->HostBackupWorkRect = inner_window->WorkRect;
    table->HostBackupParentWorkRect = inner_window->ParentWorkRect;
    table->HostBackupColumnsOffset = outer_window->DC.ColumnsOffset;
    table->HostBackupPrevLineSize = inner_window->DC.PrevLineSize;
    table->HostBackupCurrLineSize = inner_window->DC.CurrLineSize;
    table->HostBackupCursorMaxPos = inner_window->DC.CursorMaxPos;
    table->HostBackupItemWidth = outer_window->DC.ItemWidth;
    table->HostBackupItemWidthStackSize = outer_window->DC.ItemWidthStack.Size;
    inner_window->DC.PrevLineSize = inner_window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);

    // Padding and Spacing
    // - None               ........Content..... Pad .....Content........
    // - PadOuter           | Pad ..Content..... Pad .....Content.. Pad |
    // - PadInner           ........Content.. Pad | Pad ..Content........
    // - PadOuter+PadInner  | Pad ..Content.. Pad | Pad ..Content.. Pad |
    const bool pad_outer_x = (flags & ImGuiTableFlags_NoPadOuterX) ? false : (flags & ImGuiTableFlags_PadOuterX) ? true : (flags & ImGuiTableFlags_BordersOuterV) != 0;
    const bool pad_inner_x = (flags & ImGuiTableFlags_NoPadInnerX) ? false : true;
    const float inner_spacing_for_border = (flags & ImGuiTableFlags_BordersInnerV) ? TABLE_BORDER_SIZE : 0.0f;
    const float inner_spacing_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) == 0) ? g.Style.CellPadding.x : 0.0f;
    const float inner_padding_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) != 0) ? g.Style.CellPadding.x : 0.0f;
    table->CellSpacingX1 = inner_spacing_explicit + inner_spacing_for_border;
    table->CellSpacingX2 = inner_spacing_explicit;
    table->CellPaddingX = inner_padding_explicit;
    table->CellPaddingY = g.Style.CellPadding.y;

    const float outer_padding_for_border = (flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
    const float outer_padding_explicit = pad_outer_x ? g.Style.CellPadding.x : 0.0f;
    table->OuterPaddingX = (outer_padding_for_border + outer_padding_explicit) - table->CellPaddingX;

    table->CurrentColumn = -1;
    table->CurrentRow = -1;
    table->RowBgColorCounter = 0;
    table->LastRowFlags = ImGuiTableRowFlags_None;
    table->InnerClipRect = (inner_window == outer_window) ? table->WorkRect : inner_window->ClipRect;
    table->InnerClipRect.ClipWith(table->WorkRect);     // We need this to honor inner_width
    table->InnerClipRect.ClipWithFull(table->HostClipRect);
    table->InnerClipRect.Max.y = (flags & ImGuiTableFlags_NoHostExtendY) ? ImMin(table->InnerClipRect.Max.y, inner_window->WorkRect.Max.y) : inner_window->ClipRect.Max.y;

    table->RowPosY1 = table->RowPosY2 = table->WorkRect.Min.y; // This is needed somehow
    table->RowTextBaseline = 0.0f; // This will be cleared again by TableBeginRow()
    table->FreezeRowsRequest = table->FreezeRowsCount = 0; // This will be setup by TableSetupScrollFreeze(), if any
    table->FreezeColumnsRequest = table->FreezeColumnsCount = 0;
    table->IsUnfrozenRows = true;
    table->DeclColumnsCount = 0;

    // Using opaque colors facilitate overlapping elements of the grid
    table->BorderColorStrong = GetColorU32(ImGuiCol_TableBorderStrong);
    table->BorderColorLight = GetColorU32(ImGuiCol_TableBorderLight);

    // Make table current
    const int table_idx = g.Tables.GetIndex(table);
    g.CurrentTableStack.push_back(ImGuiPtrOrIndex(table_idx));
    g.CurrentTable = table;
    outer_window->DC.CurrentTableIdx = table_idx;
    if (inner_window != outer_window) // So EndChild() within the inner window can restore the table properly.
        inner_window->DC.CurrentTableIdx = table_idx;

    if ((table_last_flags & ImGuiTableFlags_Reorderable) && (flags & ImGuiTableFlags_Reorderable) == 0)
        table->IsResetDisplayOrderRequest = true;

    // Mark as used
    if (table_idx >= g.TablesLastTimeActive.Size)
        g.TablesLastTimeActive.resize(table_idx + 1, -1.0f);
    g.TablesLastTimeActive[table_idx] = (float)g.Time;
    table->MemoryCompacted = false;

    // Setup memory buffer (clear data if columns count changed)
    const int stored_size = table->Columns.size();
    if (stored_size != 0 && stored_size != columns_count)
    {
        IM_FREE(table->RawData);
        table->RawData = NULL;
    }
    if (table->RawData == NULL)
    {
        TableBeginInitMemory(table, columns_count);
        table->IsInitializing = table->IsSettingsRequestLoad = true;
    }
    if (table->IsResetAllRequest)
        TableResetSettings(table);
    if (table->IsInitializing)
    {
        // Initialize
        table->SettingsOffset = -1;
        table->IsSortSpecsDirty = true;
        table->InstanceInteracted = -1;
        table->ContextPopupColumn = -1;
        table->ReorderColumn = table->ResizedColumn = table->LastResizedColumn = -1;
        table->AutoFitSingleColumn = -1;
        table->HoveredColumnBody = table->HoveredColumnBorder = -1;
        for (int n = 0; n < columns_count; n++)
        {
            ImGuiTableColumn* column = &table->Columns[n];
            float width_auto = column->WidthAuto;
            *column = ImGuiTableColumn();
            column->WidthAuto = width_auto;
            column->IsPreserveWidthAuto = true; // Preserve WidthAuto when reinitializing a live table: not technically necessary but remove a visible flicker
            column->DisplayOrder = table->DisplayOrderToIndex[n] = (ImGuiTableColumnIdx)n;
            column->IsEnabled = column->IsEnabledNextFrame = true;
        }
    }

    // Load settings
    if (table->IsSettingsRequestLoad)
        TableLoadSettings(table);

    // Handle DPI/font resize
    // This is designed to facilitate DPI changes with the assumption that e.g. style.CellPadding has been scaled as well.
    // It will also react to changing fonts with mixed results. It doesn't need to be perfect but merely provide a decent transition.
    // FIXME-DPI: Provide consistent standards for reference size. Perhaps using g.CurrentDpiScale would be more self explanatory.
    // This is will lead us to non-rounded WidthRequest in columns, which should work but is a poorly tested path.
    const float new_ref_scale_unit = g.FontSize; // g.Font->GetCharAdvance('A') ?
    if (table->RefScale != 0.0f && table->RefScale != new_ref_scale_unit)
    {
        const float scale_factor = new_ref_scale_unit / table->RefScale;
        //IMGUI_DEBUG_LOG("[table] %08X RefScaleUnit %.3f -> %.3f, scaling width by %.3f\n", table->ID, table->RefScaleUnit, new_ref_scale_unit, scale_factor);
        for (int n = 0; n < columns_count; n++)
            table->Columns[n].WidthRequest = table->Columns[n].WidthRequest * scale_factor;
    }
    table->RefScale = new_ref_scale_unit;

    // Disable output until user calls TableNextRow() or TableNextColumn() leading to the TableUpdateLayout() call..
    // This is not strictly necessary but will reduce cases were "out of table" output will be misleading to the user.
    // Because we cannot safely assert in EndTable() when no rows have been created, this seems like our best option.
    inner_window->SkipItems = true;

    // Clear names
    // At this point the ->NameOffset field of each column will be invalid until TableUpdateLayout() or the first call to TableSetupColumn()
    if (table->ColumnsNames.Buf.Size > 0)
        table->ColumnsNames.Buf.resize(0);

    // Apply queued resizing/reordering/hiding requests
    TableBeginApplyRequests(table);

    return true;
}